

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicInversionType.hpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *os,HarmonicInversionType *hit)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"This HarmonicInversionType has below form:",0x2a);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(hit->d0_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*(phi - ",8);
  poVar1 = std::ostream::_M_insert<double>(hit->phi0_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")/2",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HarmonicInversionType& hit) {
    os << "This HarmonicInversionType has below form:" << std::endl;
    os << hit.d0_ << "*(phi - " << hit.phi0_ << ")/2" << std::endl;
    return os;
  }